

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_ge *a_00;
  secp256k1_gej *a_01;
  ulong uVar8;
  secp256k1_gej *a_02;
  ulong uVar9;
  secp256k1_ge *a_03;
  ulong uVar10;
  secp256k1_gej *a_04;
  secp256k1_fe *r_00;
  secp256k1_gej *a_05;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe az;
  secp256k1_fe s2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_fe sStack_2e0;
  secp256k1_fe sStack_2b0;
  secp256k1_gej *psStack_280;
  secp256k1_gej *psStack_278;
  secp256k1_fe *psStack_270;
  secp256k1_gej *psStack_268;
  secp256k1_gej *psStack_260;
  secp256k1_fe *local_250;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  ulong local_1f8;
  ulong local_1f0;
  undefined1 local_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t local_1a8;
  uint64_t uStack_1a0;
  ulong local_198;
  ulong local_190;
  undefined1 local_188 [56];
  uint64_t uStack_150;
  uint64_t local_148;
  uint64_t uStack_140;
  uint64_t local_138;
  int local_130;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  secp256k1_fe *local_48;
  int local_40;
  int iStack_3c;
  
  psStack_260 = (secp256k1_gej *)0x11a876;
  secp256k1_gej_verify(a);
  psStack_260 = (secp256k1_gej *)0x11a87e;
  secp256k1_ge_verify(b);
  psStack_260 = (secp256k1_gej *)0x11a886;
  secp256k1_fe_verify(bzinv);
  if (a->infinity != 0) {
    r->infinity = b->infinity;
    psStack_260 = (secp256k1_gej *)0x11a8b2;
    secp256k1_fe_sqr(&local_128,bzinv);
    psStack_260 = (secp256k1_gej *)0x11a8c8;
    secp256k1_fe_mul(&local_98,&local_128,bzinv);
    psStack_260 = (secp256k1_gej *)0x11a8d6;
    secp256k1_fe_mul(&r->x,&b->x,&local_128);
    psStack_260 = (secp256k1_gej *)0x11a8e9;
    secp256k1_fe_mul(&r->y,&b->y,&local_98);
    a = (secp256k1_gej *)&r->z;
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).magnitude = 1;
    (r->z).normalized = 1;
LAB_0011a914:
    psStack_260 = (secp256k1_gej *)0x11a919;
    secp256k1_fe_verify(&a->x);
    psStack_260 = (secp256k1_gej *)0x11a921;
    secp256k1_gej_verify(r);
    return;
  }
  if (b->infinity != 0) {
    memcpy(r,a,0x98);
    return;
  }
  local_250 = &a->z;
  psStack_260 = (secp256k1_gej *)0x11a978;
  secp256k1_fe_mul(&local_128,local_250,bzinv);
  r_00 = &local_98;
  psStack_260 = (secp256k1_gej *)0x11a98b;
  secp256k1_fe_sqr(r_00,&local_128);
  local_c8.n[0] = (a->x).n[0];
  local_c8.n[1] = (a->x).n[1];
  local_c8.n[2] = (a->x).n[2];
  local_c8.n[3] = (a->x).n[3];
  local_c8.n[4] = (a->x).n[4];
  local_c8.magnitude = (a->x).magnitude;
  local_c8.normalized = (a->x).normalized;
  psStack_260 = (secp256k1_gej *)0x11a9c0;
  secp256k1_fe_mul((secp256k1_fe *)(local_188 + 0x30),&b->x,r_00);
  local_1e8._0_8_ = (a->y).n[0];
  local_1e8._8_8_ = (a->y).n[1];
  local_1e8._16_8_ = (a->y).n[2];
  local_1e8._24_8_ = (a->y).n[3];
  local_1e8._32_8_ = (a->y).n[4];
  local_1e8._40_4_ = (a->y).magnitude;
  local_1e8._44_4_ = (a->y).normalized;
  psStack_260 = (secp256k1_gej *)0x11a9fe;
  secp256k1_fe_mul(&local_f8,&b->y,r_00);
  psStack_260 = (secp256k1_gej *)0x11aa11;
  secp256k1_fe_mul(&local_f8,&local_f8,&local_128);
  psStack_260 = (secp256k1_gej *)0x11aa19;
  secp256k1_fe_verify(&local_c8);
  a_01 = (secp256k1_gej *)0x4;
  psStack_260 = (secp256k1_gej *)0x11aa26;
  secp256k1_fe_verify_magnitude(&local_c8,4);
  local_1e8._48_8_ = 0x9ffff5ffffd9d6 - local_c8.n[0];
  uStack_1b0 = 0x9ffffffffffff6 - local_c8.n[1];
  a_05 = (secp256k1_gej *)(local_1e8 + 0x30);
  local_1a8 = 0x9ffffffffffff6 - local_c8.n[2];
  uStack_1a0 = 0x9ffffffffffff6 - local_c8.n[3];
  local_198 = 0x9fffffffffff6 - local_c8.n[4];
  local_190 = 5;
  psStack_260 = (secp256k1_gej *)0x11aa75;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  psStack_260 = (secp256k1_gej *)0x11aa7d;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  a_04 = (secp256k1_gej *)(local_188 + 0x30);
  psStack_260 = (secp256k1_gej *)0x11aa8d;
  a_02 = a_04;
  secp256k1_fe_verify((secp256k1_fe *)a_04);
  if (local_130 + (int)local_190 < 0x21) {
    local_1e8._48_8_ = local_1e8._48_8_ + local_188._48_8_;
    uStack_1b0 = uStack_1b0 + uStack_150;
    local_1a8 = local_1a8 + local_148;
    uStack_1a0 = uStack_1a0 + uStack_140;
    local_198 = local_198 + local_138;
    r_00 = (secp256k1_fe *)0x3fffffffffffc;
    local_190 = (ulong)(uint)(local_130 + (int)local_190);
    psStack_260 = (secp256k1_gej *)0x11aaf0;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    psStack_260 = (secp256k1_gej *)0x11ab00;
    secp256k1_fe_verify(&local_f8);
    a_01 = (secp256k1_gej *)0x1;
    psStack_260 = (secp256k1_gej *)0x11ab0d;
    secp256k1_fe_verify_magnitude(&local_f8,1);
    local_248._48_8_ = 0x3ffffbfffff0bc - local_f8.n[0];
    uStack_210 = 0x3ffffffffffffc - local_f8.n[1];
    a_04 = (secp256k1_gej *)(local_248 + 0x30);
    local_208 = 0x3ffffffffffffc - local_f8.n[2];
    uStack_200 = 0x3ffffffffffffc - local_f8.n[3];
    local_1f8 = 0x3fffffffffffc - local_f8.n[4];
    local_1f0 = 2;
    psStack_260 = (secp256k1_gej *)0x11ab57;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    psStack_260 = (secp256k1_gej *)0x11ab5f;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    a_05 = (secp256k1_gej *)local_1e8;
    psStack_260 = (secp256k1_gej *)0x11ab6c;
    a_02 = a_05;
    secp256k1_fe_verify((secp256k1_fe *)a_05);
    if (0x20 < local_1e8._40_4_ + (int)local_1f0) goto LAB_0011b038;
    local_248._48_8_ = local_248._48_8_ + local_1e8._0_8_;
    uStack_210 = uStack_210 + local_1e8._8_8_;
    local_208 = local_208 + local_1e8._16_8_;
    uStack_200 = uStack_200 + local_1e8._24_8_;
    local_1f8 = local_1f8 + local_1e8._32_8_;
    local_1f0 = (ulong)(uint)(local_1e8._40_4_ + (int)local_1f0);
    psStack_260 = (secp256k1_gej *)0x11abd3;
    secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
    psStack_260 = (secp256k1_gej *)0x11abe3;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    uVar6 = (local_198 >> 0x30) * 0x1000003d1 + local_1e8._48_8_;
    if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
      uVar7 = (uVar6 >> 0x34) + uStack_1b0;
      uVar8 = (uVar7 >> 0x34) + local_1a8;
      uVar9 = (uVar8 >> 0x34) + uStack_1a0;
      uVar10 = (uVar9 >> 0x34) + (local_198 & 0xffffffffffff);
      if ((((uVar7 | uVar6 | uVar8 | uVar9) & 0xfffffffffffff) == 0 && uVar10 == 0) ||
         (((uVar6 | 0x1000003d0) & uVar7 & uVar8 & uVar9 & (uVar10 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_260 = (secp256k1_gej *)0x11af75;
        secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
        uVar6 = (local_1f8 >> 0x30) * 0x1000003d1 + local_248._48_8_;
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar7 = (uVar6 >> 0x34) + uStack_210;
          uVar8 = (uVar7 >> 0x34) + local_208;
          uVar9 = (uVar8 >> 0x34) + uStack_200;
          uVar10 = (uVar9 >> 0x34) + (local_1f8 & 0xffffffffffff);
          if ((((uVar7 | uVar6 | uVar8 | uVar9) & 0xfffffffffffff) == 0 && uVar10 == 0) ||
             (((uVar6 | 0x1000003d0) & uVar7 & uVar8 & uVar9 & (uVar10 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_260 = (secp256k1_gej *)0x11b02e;
            secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_260 = (secp256k1_gej *)0x11b01c;
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    a_05 = (secp256k1_gej *)(local_1e8 + 0x30);
    psStack_260 = (secp256k1_gej *)0x11acc0;
    secp256k1_fe_mul(&r->z,local_250,(secp256k1_fe *)a_05);
    a = (secp256k1_gej *)&stack0xffffffffffffff98;
    psStack_260 = (secp256k1_gej *)0x11acd3;
    secp256k1_fe_sqr((secp256k1_fe *)a,(secp256k1_fe *)a_05);
    psStack_260 = (secp256k1_gej *)0x11acdb;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_260 = (secp256k1_gej *)0x11ace8;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_68 = 0x3ffffbfffff0bc - local_68;
    uStack_60 = 0x3ffffffffffffc - uStack_60;
    local_58 = 0x3ffffffffffffc - local_58;
    uStack_50 = 0x3ffffffffffffc - uStack_50;
    r_00 = (secp256k1_fe *)(0x3fffffffffffc - (long)local_48);
    local_40 = 2;
    iStack_3c = 0;
    psStack_260 = (secp256k1_gej *)0x11ad26;
    local_48 = r_00;
    secp256k1_fe_verify((secp256k1_fe *)a);
    a_04 = (secp256k1_gej *)local_248;
    psStack_260 = (secp256k1_gej *)0x11ad39;
    secp256k1_fe_mul((secp256k1_fe *)a_04,(secp256k1_fe *)a,(secp256k1_fe *)a_05);
    psStack_260 = (secp256k1_gej *)0x11ad51;
    secp256k1_fe_mul((secp256k1_fe *)local_188,&local_c8,(secp256k1_fe *)a);
    a_01 = (secp256k1_gej *)(local_248 + 0x30);
    psStack_260 = (secp256k1_gej *)0x11ad5e;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_01);
    psStack_260 = (secp256k1_gej *)0x11ad66;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_gej *)0x11ad6e;
    a_02 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    iVar5 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011b03d;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar2 + local_248._8_8_;
    (r->x).n[2] = uVar3 + local_248._16_8_;
    (r->x).n[3] = uVar4 + local_248._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_248._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    psStack_260 = (secp256k1_gej *)0x11adb8;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_gej *)0x11adc0;
    secp256k1_fe_verify(&r->x);
    a = (secp256k1_gej *)local_188;
    psStack_260 = (secp256k1_gej *)0x11add0;
    a_02 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    iVar5 = local_188._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011b042;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    a = (secp256k1_gej *)local_188;
    (r->x).n[0] = (r->x).n[0] + local_188._0_8_;
    (r->x).n[1] = uVar2 + local_188._8_8_;
    (r->x).n[2] = uVar3 + local_188._16_8_;
    (r->x).n[3] = uVar4 + local_188._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_188._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    psStack_260 = (secp256k1_gej *)0x11ae1f;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_gej *)0x11ae27;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_gej *)0x11ae2f;
    a_02 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    iVar5 = local_188._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0011b047;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    a = (secp256k1_gej *)local_188;
    (r->x).n[0] = (r->x).n[0] + local_188._0_8_;
    (r->x).n[1] = uVar2 + local_188._8_8_;
    (r->x).n[2] = uVar3 + local_188._16_8_;
    (r->x).n[3] = uVar4 + local_188._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_188._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    psStack_260 = (secp256k1_gej *)0x11ae7e;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_gej *)0x11ae86;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_260 = (secp256k1_gej *)0x11ae8e;
    a_02 = r;
    secp256k1_fe_verify(&r->x);
    iVar5 = (r->x).magnitude + local_188._40_4_;
    if (iVar5 < 0x21) {
      local_188._0_8_ = (r->x).n[0] + local_188._0_8_;
      local_188._8_8_ = (r->x).n[1] + local_188._8_8_;
      local_188._16_8_ = (r->x).n[2] + local_188._16_8_;
      local_188._24_8_ = (r->x).n[3] + local_188._24_8_;
      local_188._32_8_ = local_188._32_8_ + (r->x).n[4];
      local_188._44_4_ = 0;
      psStack_260 = (secp256k1_gej *)0x11aee1;
      local_188._40_4_ = iVar5;
      secp256k1_fe_verify((secp256k1_fe *)local_188);
      a = (secp256k1_gej *)&r->y;
      psStack_260 = (secp256k1_gej *)0x11aef5;
      secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)local_188,
                       (secp256k1_fe *)(local_248 + 0x30));
      a_05 = (secp256k1_gej *)local_248;
      psStack_260 = (secp256k1_gej *)0x11af0a;
      a_01 = a_05;
      secp256k1_fe_mul((secp256k1_fe *)a_05,(secp256k1_fe *)a_05,(secp256k1_fe *)local_1e8);
      psStack_260 = (secp256k1_gej *)0x11af12;
      secp256k1_fe_verify((secp256k1_fe *)a);
      psStack_260 = (secp256k1_gej *)0x11af1a;
      a_02 = a_05;
      secp256k1_fe_verify((secp256k1_fe *)a_05);
      iVar5 = local_248._40_4_ + (r->y).magnitude;
      if (iVar5 < 0x21) {
        uVar2 = (r->y).n[1];
        uVar3 = (r->y).n[2];
        uVar4 = (r->y).n[3];
        (r->y).n[0] = (r->y).n[0] + local_248._0_8_;
        (r->y).n[1] = uVar2 + local_248._8_8_;
        (r->y).n[2] = uVar3 + local_248._16_8_;
        (r->y).n[3] = uVar4 + local_248._24_8_;
        puVar1 = (r->y).n + 4;
        *puVar1 = *puVar1 + local_248._32_8_;
        (r->y).magnitude = iVar5;
        (r->y).normalized = 0;
        goto LAB_0011a914;
      }
      goto LAB_0011b051;
    }
  }
  else {
    psStack_260 = (secp256k1_gej *)0x11b038;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0011b038:
    psStack_260 = (secp256k1_gej *)0x11b03d;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0011b03d:
    psStack_260 = (secp256k1_gej *)0x11b042;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0011b042:
    psStack_260 = (secp256k1_gej *)0x11b047;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0011b047:
    psStack_260 = (secp256k1_gej *)0x11b04c;
    secp256k1_gej_add_zinv_var_cold_3();
  }
  psStack_260 = (secp256k1_gej *)0x11b051;
  secp256k1_gej_add_zinv_var_cold_2();
LAB_0011b051:
  psStack_260 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_gej_add_zinv_var_cold_1();
  psStack_280 = r;
  psStack_278 = a_04;
  psStack_270 = r_00;
  psStack_268 = a;
  psStack_260 = a_05;
  secp256k1_gej_verify(a_01);
  a_03 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if (a_01->infinity != 0) {
    secp256k1_ge_set_gej_zinv_cold_1();
    a_03->infinity = 1;
    (a_03->x).n[0] = 0;
    (a_03->x).n[1] = 0;
    (a_03->x).n[2] = 0;
    (a_03->x).n[3] = 0;
    *(undefined8 *)((long)(a_03->x).n + 0x1c) = 0;
    *(undefined8 *)((long)(a_03->x).n + 0x24) = 0;
    (a_03->x).normalized = 1;
    secp256k1_fe_verify(&a_03->x);
    *(undefined8 *)((long)(a_03->y).n + 0x1c) = 0;
    *(undefined8 *)((long)(a_03->y).n + 0x24) = 0;
    (a_03->y).n[2] = 0;
    (a_03->y).n[3] = 0;
    (a_03->y).n[0] = 0;
    (a_03->y).n[1] = 0;
    (a_03->y).normalized = 1;
    secp256k1_fe_verify(&a_03->y);
    secp256k1_ge_verify(a_03);
    return;
  }
  secp256k1_fe_sqr(&sStack_2b0,&a_00->x);
  secp256k1_fe_mul(&sStack_2e0,&sStack_2b0,&a_00->x);
  secp256k1_fe_mul(&a_02->x,&a_01->x,&sStack_2b0);
  secp256k1_fe_mul(&a_02->y,&a_01->y,&sStack_2e0);
  *(int *)(a_02->z).n = a_01->infinity;
  secp256k1_ge_verify((secp256k1_ge *)a_02);
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* Operations: 9 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    SECP256K1_FE_VERIFY(bzinv);

    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        SECP256K1_GEJ_VERIFY(r);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}